

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurl.cpp
# Opt level: O2

void __thiscall QUrl::setPort(QUrl *this,int port)

{
  QUrlPrivate *this_00;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  detach(this);
  QUrlPrivate::clearError(this->d);
  this_00 = this->d;
  if (port - 0x10000U < 0xfffeffff) {
    QString::number((QString *)&local_40,port,10);
    QUrlPrivate::setError(this_00,InvalidPortError,(QString *)&local_40,0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
    this->d->port = -1;
  }
  else {
    this_00->port = port;
    if (port != -1) {
      this_00->sectionIsPresent = this_00->sectionIsPresent | 8;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QUrl::setPort(int port)
{
    detach();
    d->clearError();

    if (port < -1 || port > 65535) {
        d->setError(QUrlPrivate::InvalidPortError, QString::number(port), 0);
        port = -1;
    }

    d->port = port;
    if (port != -1)
        d->sectionIsPresent |= QUrlPrivate::Host;
}